

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_splitor_test.cc
# Opt level: O2

void __thiscall xLearn::SpliterTest::TearDown(SpliterTest *this)

{
  uint uVar1;
  string filename;
  string local_38;
  
  for (uVar1 = 0; uVar1 != 5; uVar1 = uVar1 + 1) {
    StringPrintf_abi_cxx11_(&local_38,"%s_%d",kTestfilename_abi_cxx11_,(ulong)uVar1);
    RemoveFile(local_38._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&local_38);
  }
  RemoveFile(kTestfilename_abi_cxx11_);
  return;
}

Assistant:

virtual void TearDown() {
    for (int i = 0; i < kNumfolds; ++i) {
      string filename = StringPrintf("%s_%d", kTestfilename.c_str(), i);
      RemoveFile(filename.c_str());
    }
    RemoveFile(kTestfilename.c_str());
  }